

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_rdp.c
# Opt level: O0

_Bool csp_rdp_seq_in_rx_queue(csp_conn_t *conn,uint16_t seq_nr)

{
  int iVar1;
  csp_packet_t *packet_00;
  uint16_t in_SI;
  rdp_header_t *header;
  csp_packet_t *packet;
  int count;
  int i;
  csp_packet_t *in_stack_ffffffffffffffc8;
  csp_conn_t *in_stack_ffffffffffffffd0;
  int local_18;
  
  iVar1 = csp_rdp_queue_rx_size();
  local_18 = 0;
  while ((local_18 < iVar1 &&
         (packet_00 = csp_rdp_queue_rx_get((csp_conn_t *)0x10ead6), packet_00 != (csp_packet_t *)0x0
         ))) {
    csp_rdp_queue_rx_add(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = (csp_conn_t *)csp_rdp_header_ref(packet_00);
    if (*(uint16_t *)((long)&in_stack_ffffffffffffffd0->type + 1) == in_SI) {
      return true;
    }
    local_18 = local_18 + 1;
  }
  return false;
}

Assistant:

static inline bool csp_rdp_seq_in_rx_queue(csp_conn_t * conn, uint16_t seq_nr) {

	/* Loop through RX queue */
	int i, count;
	csp_packet_t * packet;
	count = csp_rdp_queue_rx_size();
	for (i = 0; i < count; i++) {

		packet = csp_rdp_queue_rx_get(conn);
		if (packet == NULL) {
			break;
		}

		csp_rdp_queue_rx_add(conn, packet);

		rdp_header_t * header = csp_rdp_header_ref((csp_packet_t *)packet);
		if (header->seq_nr == seq_nr) {
			return true;
		}
	}

	return false;
}